

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

void anon_unknown.dwarf_101ce38::TranslateEnvironment
               (TEnvironment *environment,EShMessages *messages,EShSource *source,EShLanguage *stage
               ,SpvVersion *spvVersion)

{
  EShSource EVar1;
  EShClient EVar2;
  EShMessages EVar3;
  long lVar4;
  
  EVar3 = *messages;
  if ((EVar3 & EShMsgSpvRules) != EShMsgDefault) {
    spvVersion->spv = 0x10000;
  }
  if ((EVar3 & EShMsgVulkanRules) == EShMsgDefault) {
    lVar4 = 0xc;
    if (spvVersion->spv != 0) goto LAB_003d9ff0;
  }
  else {
    spvVersion->vulkan = 0x400000;
    lVar4 = 4;
LAB_003d9ff0:
    *(undefined4 *)((long)&spvVersion->spv + lVar4) = 100;
  }
  if (environment == (TEnvironment *)0x0) {
    return;
  }
  EVar1 = (environment->input).languageFamily;
  if (EVar1 != EShSourceNone) {
    *stage = (environment->input).stage;
    EVar2 = (environment->input).dialect;
    if (EVar2 == EShClientVulkan) {
      spvVersion->vulkanGlsl = (environment->input).dialectVersion;
      spvVersion->vulkanRelaxed = (environment->input).vulkanRulesRelaxed;
    }
    else if (EVar2 == EShClientOpenGL) {
      spvVersion->openGl = (environment->input).dialectVersion;
    }
    else if (EVar2 == EShClientCount) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                    ,0x2da,
                    "void (anonymous namespace)::TranslateEnvironment(const TEnvironment *, EShMessages &, EShSource &, EShLanguage &, SpvVersion &)"
                   );
    }
    if (EVar1 == EShSourceGlsl) {
      *source = EShSourceGlsl;
      EVar3 = EVar3 & ~EShMsgReadHlsl;
    }
    else {
      if (EVar1 != EShSourceHlsl) {
        if (EVar1 == EShSourceCount) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                        ,0x2e9,
                        "void (anonymous namespace)::TranslateEnvironment(const TEnvironment *, EShMessages &, EShSource &, EShLanguage &, SpvVersion &)"
                       );
        }
        goto LAB_003da0a3;
      }
      *source = EShSourceHlsl;
      EVar3 = EVar3 | EShMsgReadHlsl;
    }
    *messages = EVar3;
  }
LAB_003da0a3:
  if ((environment->client).client == EShClientVulkan) {
    spvVersion->vulkan = (environment->client).version;
  }
  if ((environment->target).language == EShTargetSpv) {
    spvVersion->spv = (environment->target).version;
  }
  return;
}

Assistant:

void TranslateEnvironment(const TEnvironment* environment, EShMessages& messages, EShSource& source,
                          EShLanguage& stage, SpvVersion& spvVersion)
{
    // Set up environmental defaults, first ignoring 'environment'.
    if (messages & EShMsgSpvRules)
        spvVersion.spv = EShTargetSpv_1_0;
    if (messages & EShMsgVulkanRules) {
        spvVersion.vulkan = EShTargetVulkan_1_0;
        spvVersion.vulkanGlsl = 100;
    } else if (spvVersion.spv != 0)
        spvVersion.openGl = 100;

    // Now, override, based on any content set in 'environment'.
    // 'environment' must be cleared to ESh*None settings when items
    // are not being set.
    if (environment != nullptr) {
        // input language
        if (environment->input.languageFamily != EShSourceNone) {
            stage = environment->input.stage;
            switch (environment->input.dialect) {
            case EShClientNone:
                break;
            case EShClientVulkan:
                spvVersion.vulkanGlsl = environment->input.dialectVersion;
                spvVersion.vulkanRelaxed = environment->input.vulkanRulesRelaxed;
                break;
            case EShClientOpenGL:
                spvVersion.openGl = environment->input.dialectVersion;
                break;
            case EShClientCount:
                assert(0);
                break;
            }
            switch (environment->input.languageFamily) {
            case EShSourceNone:
                break;
            case EShSourceGlsl:
                source = EShSourceGlsl;
                messages = static_cast<EShMessages>(messages & ~EShMsgReadHlsl);
                break;
            case EShSourceHlsl:
                source = EShSourceHlsl;
                messages = static_cast<EShMessages>(messages | EShMsgReadHlsl);
                break;
            case EShSourceCount:
                assert(0);
                break;
            }
        }

        // client
        switch (environment->client.client) {
        case EShClientVulkan:
            spvVersion.vulkan = environment->client.version;
            break;
        default:
            break;
        }

        // generated code
        switch (environment->target.language) {
        case EshTargetSpv:
            spvVersion.spv = environment->target.version;
            break;
        default:
            break;
        }
    }
}